

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O2

void __thiscall
testing::internal::GoogleTestFailureReporter::ReportFailure
          (GoogleTestFailureReporter *this,FailureType type,char *file,int line,string *message)

{
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  Message::Message((Message *)&local_28);
  AssertHelper::AssertHelper
            (&local_30,(type == kFatal) + kNonFatalFailure,file,line,(message->_M_dataplus)._M_p);
  AssertHelper::operator=(&local_30,(Message *)&local_28);
  AssertHelper::~AssertHelper(&local_30);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
  if (type != kFatal) {
    return;
  }
  abort();
}

Assistant:

virtual void ReportFailure(FailureType type, const char* file, int line,
                             const string& message) {
    AssertHelper(type == kFatal ?
                 TestPartResult::kFatalFailure :
                 TestPartResult::kNonFatalFailure,
                 file,
                 line,
                 message.c_str()) = Message();
    if (type == kFatal) {
      posix::Abort();
    }
  }